

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O3

wstring * __thiscall
mjs::number_to_exponential_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int f)

{
  wchar_t wVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  wstringstream wss;
  wchar_t local_1cc;
  double local_1c8;
  long local_1b0;
  ulong uStack_1a8;
  wostream local_1a0 [8];
  undefined4 local_198 [26];
  ios_base local_130 [264];
  
  local_1c8 = x;
  if ((0x7fefffffffffffff < (ulong)ABS(x)) || (uVar4 = (uint)this, 0x14 < uVar4)) {
    __assert_fail("std::isfinite(x) && f >= 0 && f <= 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0xae,"std::wstring mjs::number_to_exponential(double, int)");
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&local_1b0);
  dVar5 = local_1c8;
  if (local_1c8 < 0.0) {
    local_1cc = L'-';
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(local_1a0,&local_1cc,1);
    dVar5 = -local_1c8;
  }
  uVar3 = 0x12;
  if (uVar4 != 0) {
    uVar3 = (ulong)this & 0xffffffff;
  }
  *(ulong *)((long)&uStack_1a8 + *(long *)(local_1b0 + -0x18)) = uVar3;
  *(undefined4 *)((long)local_198 + *(long *)(local_1b0 + -0x18)) = 0x100;
  std::wostream::_M_insert<double>(dVar5);
  std::__cxx11::wstringbuf::str();
  if (uVar4 == 0) {
    lVar2 = std::__cxx11::wstring::rfind((wchar_t)__return_storage_ptr__,0x65);
    uVar3 = lVar2 - 1;
    if (0xfffffffffffffffd < uVar3) {
      __assert_fail("e_pos != std::wstring::npos && e_pos > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                    ,0xbc,"std::wstring mjs::number_to_exponential(double, int)");
    }
    for (; wVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar3], wVar1 == L'0';
        uVar3 = uVar3 - 1) {
      std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,uVar3);
    }
    if (wVar1 == L'.') {
      std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,uVar3);
    }
  }
  lVar2 = std::__cxx11::wstring::rfind((wchar_t)__return_storage_ptr__,0x65);
  if (((lVar2 != -1) && (lVar2 + 2U < __return_storage_ptr__->_M_string_length)) &&
     ((wVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[lVar2 + 1], wVar1 == L'+' ||
      (wVar1 == L'-')))) {
    while ((lVar2 + 3U < __return_storage_ptr__->_M_string_length &&
           ((__return_storage_ptr__->_M_dataplus)._M_p[lVar2 + 2] == L'0'))) {
      std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,lVar2 + 2U);
    }
    std::__cxx11::wstringstream::~wstringstream((wstringstream *)&local_1b0);
    std::ios_base::~ios_base(local_130);
    return __return_storage_ptr__;
  }
  __assert_fail("e_pos != std::wstring::npos && e_pos+2 < s.length() && (s[e_pos+1] == \'+\' || s[e_pos+1] == \'-\')"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0xcc,"std::wstring mjs::number_to_exponential(double, int)");
}

Assistant:

std::wstring number_to_exponential(double x, int f) {
    // TODO: Implement actual rules from ES3, 15.7.4.6
    assert(std::isfinite(x) && f >= 0 && f <= 20);
    std::wstringstream wss;
    if (x < 0) {
        x = -x;
        wss << L'-';
    }
    wss.precision(f ? f : 18);
    wss.flags(std::ios::scientific);
    wss << x;
    auto s = wss.str();

    // Remove unnecessary digits (yuck)
    if (f == 0) {
        auto e_pos = s.find_last_of(L'e');
        assert(e_pos != std::wstring::npos && e_pos > 0);
        for (;;) {
            --e_pos;
            if (s[e_pos] == '.') {
                s.erase(e_pos, 1);
                break;
            }
            if (s[e_pos] != '0') {
                break;
            }
            s.erase(e_pos, 1);
        }
    }

    // Fix up the exponent to match ECMAscript format (yuck)
    auto e_pos = s.find_last_of(L'e');
    assert(e_pos != std::wstring::npos && e_pos+2 < s.length() && (s[e_pos+1] == '+' || s[e_pos+1] == '-'));
    e_pos += 2;

    // Remove leading zeros in exponent
    while (e_pos + 1 < s.length() && s[e_pos] == L'0') {
        s.erase(e_pos, 1);
    }

    return s;
}